

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hashutil.cpp
# Opt level: O2

void __thiscall
HashUtil_Sha512ByteData256_Test::~HashUtil_Sha512ByteData256_Test
          (HashUtil_Sha512ByteData256_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(HashUtil, Sha512ByteData256) {
  ByteData256 target(
      "1234567890123456789012345678901234567890123456789012345678901234");
  ByteData byte_data = HashUtil::Sha512(target);
  EXPECT_STREQ(
      byte_data.GetHex().c_str(),
      "f7487034525bc244358a1dc44f1a91a3abb475585b138d775a1d5d77c7279dff00a315cb32fbecea448baf6d471bac6b26427b0c0c53cf3d88a3a284a382b5f1");
}